

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O3

void PrintEnterBlock(ExpressionGraphContext *ctx,InplaceStr name,TypeBase *type)

{
  char *str;
  char *pcVar1;
  
  PrintIndent(ctx);
  if (name.begin != name.end) {
    OutputContext::Print(ctx->output,name.begin,(int)name.end - (int)name.begin);
    OutputContext::Print(ctx->output,": ",2);
  }
  if (type != (TypeBase *)0x0) {
    str = (type->name).begin;
    pcVar1 = (type->name).end;
    if (str != pcVar1) {
      OutputContext::Print(ctx->output,str,(int)pcVar1 - (int)str);
      OutputContext::Print(ctx->output," ",1);
    }
  }
  OutputContext::Print(ctx->output,"{\n",2);
  ctx->depth = ctx->depth + 1;
  return;
}

Assistant:

void PrintEnterBlock(ExpressionGraphContext &ctx, InplaceStr name, TypeBase *type)
{
	PrintIndent(ctx);

	if(!name.empty())
	{
		ctx.output.Print(name.begin, unsigned(name.end - name.begin));
		ctx.output.Print(": ");
	}

	if(type && !type->name.empty())
	{
		ctx.output.Print(type->name.begin, unsigned(type->name.end - type->name.begin));
		ctx.output.Print(" ");
	}

	ctx.output.Print("{\n");

	ctx.depth++;
}